

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_lea(void)

{
  byte bVar1;
  char cVar2;
  short sVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  vm_register *pvVar7;
  undefined4 *puVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  
  pvVar7 = registe_ptr;
  uVar4 = registe_ptr->IP;
  bVar1 = code_ptr[uVar4 + 2];
  bVar5 = bVar1 >> 4;
  bVar9 = bVar1 & 0xf;
  if (code_ptr[uVar4 + 1] == '\x01') {
    if (bVar9 == 2) {
      uVar4 = *(uint *)(code_ptr + (ulong)uVar4 + 3);
      *register_list[bVar5] = uVar4;
      if (uVar4 != 0) {
        pvVar7->flag[0] = '\x01';
        if (0 < (int)uVar4) {
          pvVar7->flag[1] = '\x01';
          return 1;
        }
        pvVar7->flag[1] = '\0';
        return 1;
      }
    }
    else {
      if (bVar9 == 1) {
        sVar3 = *(short *)(code_ptr + (ulong)uVar4 + 3);
        *(short *)register_list[bVar5] = sVar3;
        bVar11 = sVar3 < 0;
        bVar10 = sVar3 == 0;
      }
      else {
        if ((bVar1 & 0xf) != 0) goto LAB_00102e8f;
        cVar2 = code_ptr[uVar4 + 3];
        *(char *)register_list[bVar5] = cVar2;
        bVar11 = cVar2 < '\0';
        bVar10 = cVar2 == '\0';
        pvVar7 = registe_ptr;
      }
      if (!bVar10) {
        if (!bVar10 && !bVar11) {
          pvVar7->flag[0] = '\x01';
          pvVar7->flag[1] = '\x01';
          return 1;
        }
        if (!bVar11) {
          return 1;
        }
        pvVar7->flag[0] = '\x01';
        pvVar7->flag[1] = '\0';
        return 1;
      }
    }
    pvVar7->flag[0] = '\0';
  }
  else {
    if (code_ptr[uVar4 + 1] != '\0') {
LAB_00102e8f:
      puVar8 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar8 = 0xf6;
      __cxa_throw(puVar8,&int::typeinfo,0);
    }
    bVar6 = (byte)code_ptr[uVar4 + 3] >> 4;
    if (bVar9 == 2) {
      *register_list[bVar5] = *register_list[bVar6];
    }
    else if (bVar9 == 1) {
      *(short *)register_list[bVar5] = (short)*register_list[bVar6];
    }
    else if ((bVar1 & 0xf) == 0) {
      *(char *)register_list[bVar5] = (char)*register_list[bVar6];
    }
  }
  return 1;
}

Assistant:

int do_lea() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	switch (code_ptr[registe_ptr->IP + 1])//操作类型
	{
	case '\x00': {
		//
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra = *Rb;
			break;
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra = *Rb;
			break;
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra = *Rb;
			break;
		}
		break;
	}
	case '\x01': {//
		if (low == 0)//低位运算
		{
			unsigned temp = code_ptr[registe_ptr->IP + 2 + 1];//获得立即数
			char *R = (char *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(short*)(code_ptr+registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr+registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	default: {
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;
}